

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_generators.hpp
# Opt level: O0

void __thiscall
Catch::Generators::Generators<float>::Generators<Catch::Generators::GeneratorWrapper<float>,float>
          (Generators<float> *this,GeneratorWrapper<float> *moreGenerators,float *moreGenerators_1)

{
  float *moreGenerators_local_1;
  GeneratorWrapper<float> *moreGenerators_local;
  Generators<float> *this_local;
  
  IGenerator<float>::IGenerator(&this->super_IGenerator<float>);
  (this->super_IGenerator<float>).super_GeneratorUntypedBase._vptr_GeneratorUntypedBase =
       (_func_int **)&PTR_next_007bdae8;
  std::
  vector<Catch::Generators::GeneratorWrapper<float>,_std::allocator<Catch::Generators::GeneratorWrapper<float>_>_>
  ::vector(&this->m_generators);
  this->m_current = 0;
  std::
  vector<Catch::Generators::GeneratorWrapper<float>,_std::allocator<Catch::Generators::GeneratorWrapper<float>_>_>
  ::reserve(&this->m_generators,2);
  add_generators<Catch::Generators::GeneratorWrapper<float>,float>
            (this,moreGenerators,moreGenerators_1);
  return;
}

Assistant:

Generators(Gs &&... moreGenerators) {
            m_generators.reserve(sizeof...(Gs));
            add_generators(CATCH_FORWARD(moreGenerators)...);
        }